

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::statement_base_*>,_phmap::priv::HashEq<cs::statement_base_*,_void>::Hash,_phmap::priv::HashEq<cs::statement_base_*,_void>::Eq,_std::allocator<cs::statement_base_*>_>
::initialize_slots(raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::statement_base_*>,_phmap::priv::HashEq<cs::statement_base_*,_void>::Hash,_phmap::priv::HashEq<cs::statement_base_*,_void>::Eq,_std::allocator<cs::statement_base_*>_>
                   *this,size_t new_capacity)

{
  char *p;
  CopyConst<char,_ElementType<0UL>_> *pCVar1;
  CopyConst<char,_ElementType<1UL>_>_conflict9 *ppsVar2;
  Layout layout;
  LayoutType<sizeof___(Ts),_signed_char,_cs::statement_base_*> local_30;
  
  if (new_capacity != 0) {
    local_30.size_ = (size_t  [2])MakeLayout(new_capacity);
    p = (char *)Allocate<8ul,std::allocator<cs::statement_base*>>
                          ((allocator<cs::statement_base_*> *)&this->settings_,
                           (local_30.size_[0] + 7 & 0xfffffffffffffff8) + local_30.size_[1] * 8);
    pCVar1 = internal_layout::
             LayoutImpl<std::tuple<signed_char,cs::statement_base*>,phmap::integer_sequence<unsigned_long,0ul,1ul>,phmap::integer_sequence<unsigned_long,0ul,1ul>>
             ::Pointer<0ul,char>((LayoutImpl<std::tuple<signed_char,cs::statement_base*>,phmap::integer_sequence<unsigned_long,0ul,1ul>,phmap::integer_sequence<unsigned_long,0ul,1ul>>
                                  *)&local_30,p);
    this->ctrl_ = pCVar1;
    ppsVar2 = internal_layout::
              LayoutImpl<std::tuple<signed_char,cs::statement_base*>,phmap::integer_sequence<unsigned_long,0ul,1ul>,phmap::integer_sequence<unsigned_long,0ul,1ul>>
              ::Pointer<1ul,char>((LayoutImpl<std::tuple<signed_char,cs::statement_base*>,phmap::integer_sequence<unsigned_long,0ul,1ul>,phmap::integer_sequence<unsigned_long,0ul,1ul>>
                                   *)&local_30,p);
    this->slots_ = ppsVar2;
    memset(this->ctrl_,0x80,new_capacity + 0x10);
    this->ctrl_[new_capacity] = -1;
    reset_growth_left(this,new_capacity);
    return;
  }
  __assert_fail("new_capacity",
                "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                ,0x8b8,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::statement_base *>, phmap::priv::HashEq<cs::statement_base *>::Hash, phmap::priv::HashEq<cs::statement_base *>::Eq, std::allocator<cs::statement_base *>>::initialize_slots(size_t) [Policy = phmap::priv::FlatHashSetPolicy<cs::statement_base *>, Hash = phmap::priv::HashEq<cs::statement_base *>::Hash, Eq = phmap::priv::HashEq<cs::statement_base *>::Eq, Alloc = std::allocator<cs::statement_base *>]"
               );
}

Assistant:

void initialize_slots(size_t new_capacity)
			{
				assert(new_capacity);
				if (std::is_same<SlotAlloc, std::allocator<slot_type>>::value &&
				        slots_ == nullptr) {
					infoz_ = Sample();
				}

				auto layout = MakeLayout(new_capacity);
				char* mem = static_cast<char*>(
				                Allocate<Layout::Alignment()>(&alloc_ref(), layout.AllocSize()));
				ctrl_ = reinterpret_cast<ctrl_t*>(layout.template Pointer<0>(mem));
				slots_ = layout.template Pointer<1>(mem);
				reset_ctrl(new_capacity);
				reset_growth_left(new_capacity);
				infoz_.RecordStorageChanged(size_, new_capacity);
			}